

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain_typed_unittest.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::
Policies<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::TestBody
          (Policies<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate> *this)

{
  char *in_RSI;
  
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"unknown-critical-policy-qualifier/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"unknown-non-critical-policy-qualifier/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-ok/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-ok/ta-with-constraints.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-on-root-ok/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-on-root-ok/ta-with-constraints.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-on-root-wrong/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-on-root-wrong/ta-with-constraints.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-required-by-root-ok/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-required-by-root-ok/ta-with-constraints.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-required-by-root-fail/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-required-by-root-fail/ta-with-constraints.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-inhibit-mapping-by-root-ok/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-inhibit-mapping-by-root-ok/ta-with-constraints.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-inhibit-mapping-by-root-fail/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-inhibit-mapping-by-root-fail/ta-with-constraints.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policy-mappings-on-root-ok/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policy-mappings-on-root-ok/ta-with-constraints.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policy-mappings-on-root-fail/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policy-mappings-on-root-fail/ta-with-constraints.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-inhibit-anypolicy-by-root-ok/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-inhibit-anypolicy-by-root-ok/ta-with-constraints.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-inhibit-anypolicy-by-root-fail/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)"policies-inhibit-anypolicy-by-root-fail/ta-with-constraints.test",in_RSI);
  return;
}

Assistant:

TYPED_TEST_P(VerifyCertificateChainSingleRootTest, Policies) {
  this->RunTest("unknown-critical-policy-qualifier/main.test");
  this->RunTest("unknown-non-critical-policy-qualifier/main.test");

  this->RunTest("policies-ok/main.test");
  this->RunTest("policies-ok/ta-with-constraints.test");

  this->RunTest("policies-on-root-ok/main.test");
  this->RunTest("policies-on-root-ok/ta-with-constraints.test");
  this->RunTest("policies-on-root-wrong/main.test");
  this->RunTest("policies-on-root-wrong/ta-with-constraints.test");

  this->RunTest("policies-required-by-root-ok/main.test");
  this->RunTest("policies-required-by-root-ok/ta-with-constraints.test");
  this->RunTest("policies-required-by-root-fail/main.test");
  this->RunTest("policies-required-by-root-fail/ta-with-constraints.test");

  this->RunTest("policies-inhibit-mapping-by-root-ok/main.test");
  this->RunTest("policies-inhibit-mapping-by-root-ok/ta-with-constraints.test");
  this->RunTest("policies-inhibit-mapping-by-root-fail/main.test");
  this->RunTest(
      "policies-inhibit-mapping-by-root-fail/ta-with-constraints.test");

  this->RunTest("policy-mappings-on-root-ok/main.test");
  this->RunTest("policy-mappings-on-root-ok/ta-with-constraints.test");
  this->RunTest("policy-mappings-on-root-fail/main.test");
  this->RunTest("policy-mappings-on-root-fail/ta-with-constraints.test");

  this->RunTest("policies-inhibit-anypolicy-by-root-ok/main.test");
  this->RunTest(
      "policies-inhibit-anypolicy-by-root-ok/ta-with-constraints.test");
  this->RunTest("policies-inhibit-anypolicy-by-root-fail/main.test");
  this->RunTest(
      "policies-inhibit-anypolicy-by-root-fail/ta-with-constraints.test");
}